

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

int lua_setfenv(lua_State *L,int idx)

{
  byte bVar1;
  int iVar2;
  StkId pTVar3;
  GCObject *pGVar4;
  global_State *g;
  int iVar5;
  
  pTVar3 = L->top;
  iVar2 = pTVar3[-2].tt;
  if (iVar2 == 8) {
    pGVar4 = pTVar3[-2].value.gc;
    (pGVar4->th).l_gt.value = pTVar3[-1].value;
    (pGVar4->th).l_gt.tt = 5;
  }
  else {
    if ((iVar2 != 7) && (iVar5 = 0, iVar2 != 6)) goto LAB_00110545;
    ((pTVar3[-2].value.gc)->h).array = (TValue *)pTVar3[-1].value;
  }
  pGVar4 = L->top[-1].value.gc;
  iVar5 = 1;
  if (((pGVar4->gch).marked & 3) != 0) {
    bVar1 = ((pTVar3[-2].value.gc)->gch).marked;
    if ((bVar1 & 4) != 0) {
      g = L->l_G;
      if (g->gcstate == '\x01') {
        reallymarkobject(g,pGVar4);
      }
      else {
        ((pTVar3[-2].value.gc)->gch).marked = g->currentwhite & 3 | bVar1 & 0xf8;
      }
    }
  }
LAB_00110545:
  L->top = L->top + -1;
  return iVar5;
}

Assistant:

static int lua_setfenv(lua_State*L,int idx){
StkId o;
int res=1;
api_checknelems(L,1);
o=index2adr(L,idx);
api_checkvalidindex(L,o);
luai_apicheck(L,ttistable(L->top-1));
switch(ttype(o)){
case 6:
clvalue(o)->c.env=hvalue(L->top-1);
break;
case 7:
uvalue(o)->env=hvalue(L->top-1);
break;
case 8:
sethvalue(L,gt(thvalue(o)),hvalue(L->top-1));
break;
default:
res=0;
break;
}
if(res)luaC_objbarrier(L,gcvalue(o),hvalue(L->top-1));
L->top--;
return res;
}